

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall
lest::make_string<int,double>(string *__return_storage_ptr__,lest *this,pair<int,_double> *pair)

{
  ostream *poVar1;
  ostringstream oss;
  pointer local_1d0;
  size_type local_1c8;
  char in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe41;
  undefined8 uStack_1b8;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"{ ");
  to_string_abi_cxx11_(0);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,", ");
  to_string_abi_cxx11_((double)CONCAT71(in_stack_fffffffffffffe41,in_stack_fffffffffffffe40));
  poVar1 = std::operator<<(poVar1,local_1b0);
  std::operator<<(poVar1," }");
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1d0 == &stack0xfffffffffffffe40) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(in_stack_fffffffffffffe41,in_stack_fffffffffffffe40);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1b8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1d0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(in_stack_fffffffffffffe41,in_stack_fffffffffffffe40);
  }
  __return_storage_ptr__->_M_string_length = local_1c8;
  local_1c8 = 0;
  local_1d0 = &stack0xfffffffffffffe40;
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( std::pair<T1,T2> const & pair ) -> std::string
{
    std::ostringstream oss;
    oss << "{ " << to_string( pair.first ) << ", " << to_string( pair.second ) << " }";
    return oss.str();
}